

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_attribute.h
# Opt level: O2

CustomAttributeSig * __thiscall
winmd::reader::CustomAttribute::Value
          (CustomAttributeSig *__return_storage_ptr__,CustomAttribute *this)

{
  database *pdVar1;
  coded_index<winmd::reader::CustomAttributeType> cVar2;
  byte_view cursor;
  MethodDefSig local_e8;
  
  cVar2 = Type(this);
  cursor.m_last._0_4_ =
       (cVar2.super_typed_index<winmd::reader::CustomAttributeType>.
        super_index_base<winmd::reader::CustomAttributeType>.m_value >> 3) - 1;
  pdVar1 = (cVar2.super_typed_index<winmd::reader::CustomAttributeType>.
            super_index_base<winmd::reader::CustomAttributeType>.m_table)->m_database;
  if ((cVar2.super_typed_index<winmd::reader::CustomAttributeType>.
       super_index_base<winmd::reader::CustomAttributeType>.m_value & 7) == 3) {
    cursor.m_first = (uint8_t *)&pdVar1->MemberRef;
    MemberRef::MethodSignature(&local_e8,(MemberRef *)&cursor);
  }
  else {
    cursor.m_first = (uint8_t *)&pdVar1->MethodDef;
    MethodDef::Signature(&local_e8,(MethodDef *)&cursor);
  }
  row_base<winmd::reader::CustomAttribute>::get_blob
            ((row_base<winmd::reader::CustomAttribute> *)&cursor,(uint32_t)this);
  CustomAttributeSig::CustomAttributeSig
            (__return_storage_ptr__,(this->super_row_base<winmd::reader::CustomAttribute>).m_table,
             &cursor,&local_e8);
  MethodDefSig::~MethodDefSig(&local_e8);
  return __return_storage_ptr__;
}

Assistant:

inline auto CustomAttribute::Value() const
    {
        auto const ctor = Type();
        MethodDefSig const& method_sig = ctor.type() == CustomAttributeType::MemberRef ? ctor.MemberRef().MethodSignature() : ctor.MethodDef().Signature();
        auto cursor = get_blob(2);
        return CustomAttributeSig{ get_table(), cursor, method_sig };
    }